

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DonateStrategy.cpp
# Opt level: O2

void __thiscall xmrig::DonateStrategy::tick(DonateStrategy *this,uint64_t now)

{
  IClient *pIVar1;
  
  this->m_now = now;
  (*this->m_strategy->_vptr_IStrategy[8])();
  pIVar1 = this->m_proxy;
  if (pIVar1 != (IClient *)0x0) {
    (*pIVar1->_vptr_IClient[0x19])(pIVar1,now);
  }
  if ((this->m_state == STATE_WAIT) && (this->m_timestamp < now)) {
    setState(this,STATE_IDLE);
    return;
  }
  return;
}

Assistant:

void xmrig::DonateStrategy::tick(uint64_t now)
{
    m_now = now;

    m_strategy->tick(now);

    if (m_proxy) {
        m_proxy->tick(now);
    }

    if (state() == STATE_WAIT && now > m_timestamp) {
        setState(STATE_IDLE);
    }
}